

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::RemoveExportBuildFileGeneratorCMP0024(cmMakefile *this,cmExportBuildFileGenerator *gen)

{
  bool bVar1;
  const_iterator local_40;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  local_38;
  cmExportBuildFileGenerator **local_30;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  local_28;
  __normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
  local_20;
  iterator it;
  cmExportBuildFileGenerator *gen_local;
  cmMakefile *this_local;
  
  it._M_current = (cmExportBuildFileGenerator **)gen;
  local_28._M_current =
       (cmExportBuildFileGenerator **)
       std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
       begin(&this->ExportBuildFileGenerators);
  local_30 = (cmExportBuildFileGenerator **)
             std::
             vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::
             end(&this->ExportBuildFileGenerators);
  local_20 = std::
             find<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator**,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>,cmExportBuildFileGenerator*>
                       (local_28,(__normal_iterator<cmExportBuildFileGenerator_**,_std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>_>
                                  )local_30,(cmExportBuildFileGenerator **)&it);
  local_38._M_current =
       (cmExportBuildFileGenerator **)
       std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::end
                 (&this->ExportBuildFileGenerators);
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_38);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<cmExportBuildFileGenerator*const*,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>
    ::__normal_iterator<cmExportBuildFileGenerator**>
              ((__normal_iterator<cmExportBuildFileGenerator*const*,std::vector<cmExportBuildFileGenerator*,std::allocator<cmExportBuildFileGenerator*>>>
                *)&local_40,&local_20);
    std::vector<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>::erase
              (&this->ExportBuildFileGenerators,local_40);
  }
  return;
}

Assistant:

void cmMakefile::RemoveExportBuildFileGeneratorCMP0024(
    cmExportBuildFileGenerator* gen)
{
  std::vector<cmExportBuildFileGenerator*>::iterator it =
      std::find(this->ExportBuildFileGenerators.begin(),
                this->ExportBuildFileGenerators.end(), gen);
  if(it != this->ExportBuildFileGenerators.end())
    {
    this->ExportBuildFileGenerators.erase(it);
    }
}